

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arch_specific.cc
# Opt level: O1

double highwayhash::NominalClockRate(void)

{
  int iVar1;
  
  if (NominalClockRate()::cycles_per_second == '\0') {
    iVar1 = __cxa_guard_acquire(&NominalClockRate()::cycles_per_second);
    if (iVar1 != 0) {
      NominalClockRate::cycles_per_second = anon_unknown_5::DetectNominalClockRate();
      __cxa_guard_release(&NominalClockRate()::cycles_per_second);
    }
  }
  return NominalClockRate::cycles_per_second;
}

Assistant:

double NominalClockRate() {
  // Thread-safe caching - this is called several times.
  static const double cycles_per_second = DetectNominalClockRate();
  return cycles_per_second;
}